

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Normalization.hpp
# Opt level: O0

RealConstantType *
Kernel::InequalityNormalizer::qGcd<Kernel::RealConstantType>
          (RealConstantType *l,RealConstantType *r)

{
  InnerType *num;
  RationalConstantType *in_RDX;
  RationalConstantType *in_RSI;
  RealConstantType *in_RDI;
  InnerType *in_stack_ffffffffffffffd0;
  InnerType *in_stack_ffffffffffffffd8;
  RealConstantType *in_stack_ffffffffffffffe0;
  
  num = RationalConstantType::numerator(in_RSI);
  RationalConstantType::numerator(in_RDX);
  IntegerConstantType::gcd(&in_RSI->_num,num);
  RationalConstantType::denominator(in_RSI);
  RationalConstantType::denominator(in_RDX);
  IntegerConstantType::lcm(&in_RSI->_num,num);
  RealConstantType::RealConstantType
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x458f76);
  IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x458f80);
  return in_RDI;
}

Assistant:

static Numeral qGcd(Numeral l, Numeral r)
    { return Numeral(  l.numerator().gcd(r.numerator()),
                     l.denominator().lcm(r.denominator())); }